

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O0

void __thiscall
bgui::ImageWindow::ImageWindow
          (ImageWindow *this,ImageFloat *image,int x,int y,int w,int h,double vmin,double vmax)

{
  int iVar1;
  ImageAdapterBase *adapter;
  ostream *poVar2;
  long lVar3;
  ostream *poVar4;
  BaseWindow *this_00;
  BaseWindow *this_01;
  int in_ECX;
  int in_EDX;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_000000a0;
  int in_stack_000000a4;
  ostringstream os;
  BaseWindow *in_stack_000000b0;
  ImageAdapterBase *p;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  ImageWindow *in_stack_fffffffffffffd80;
  long in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffda0;
  undefined1 uVar5;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  double in_stack_fffffffffffffdb0;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffffdb8;
  ImageAdapter<float> *in_stack_fffffffffffffdc0;
  undefined1 size_max;
  string *this_02;
  ImageWindow *in_stack_fffffffffffffe00;
  ostringstream local_1e0 [376];
  string local_68 [48];
  ImageAdapterBase *local_38;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  Image<float,_gimage::PixelTraits<float>_> *local_10;
  
  uVar5 = (undefined1)((ulong)in_stack_fffffffffffffda0 >> 0x38);
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  BaseWindow::BaseWindow(in_stack_000000b0,_os,in_stack_000000a4,in_stack_000000a0);
  *in_RDI = &PTR__ImageWindow_00146708;
  this_02 = (string *)(in_RDI + 4);
  std::__cxx11::string::string(this_02);
  adapter = (ImageAdapterBase *)operator_new(0xa8);
  ImageAdapter<float>::ImageAdapter
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
             (double)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),(bool)uVar5);
  in_RDI[2] = 0;
  *(undefined1 *)(in_RDI + 3) = 0;
  *(undefined1 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 9) = 0;
  *(undefined4 *)((long)in_RDI + 0x44) = 0;
  *(undefined1 *)((long)in_RDI + 0x54) = 0;
  local_38 = adapter;
  (anonymous_namespace)::createHelpText_abi_cxx11_();
  addHelpText(in_stack_fffffffffffffd80,
              (string *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  uVar5 = (undefined1)((uint)in_stack_fffffffffffffd7c >> 0x18);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::ostringstream::ostringstream(local_1e0);
  poVar2 = std::operator<<((ostream *)local_1e0,"Image - ");
  lVar3 = gimage::Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10);
  poVar4 = (ostream *)std::ostream::operator<<(poVar2,lVar3);
  size_max = (undefined1)((ulong)poVar2 >> 0x38);
  poVar2 = std::operator<<(poVar4,"x");
  lVar3 = gimage::Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar3);
  poVar2 = std::operator<<(poVar2,"x");
  iVar1 = gimage::Image<float,_gimage::PixelTraits<float>_>::getDepth(local_10);
  this_00 = (BaseWindow *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<((ostream *)this_00," ");
  this_01 = (BaseWindow *)
            gimage::Image<float,_gimage::PixelTraits<float>_>::getTypeDescription
                      ((Image<float,_gimage::PixelTraits<float>_> *)0x11e679);
  std::operator<<(poVar2,(char *)this_01);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::c_str();
  BaseWindow::setTitle(this_00,(char *)poVar2);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
  if (local_1c < 1) {
    in_stack_fffffffffffffd88 =
         gimage::Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10);
    local_1c = (int)in_stack_fffffffffffffd88;
  }
  if (local_20 < 1) {
    in_stack_fffffffffffffd80 =
         (ImageWindow *)gimage::Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
    local_20 = (int)in_stack_fffffffffffffd80;
  }
  setAdapter(in_stack_fffffffffffffe00,adapter,SUB81((ulong)this_02 >> 0x38,0),(keep)this_02,
             (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(bool)size_max);
  BaseWindow::setVisible(&in_stack_fffffffffffffd80->super_BaseWindow,(bool)uVar5);
  if ((-1 < local_14) && (-1 < local_18)) {
    BaseWindow::setPosition
              (this_01,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
               (int)in_stack_fffffffffffffd88);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1e0);
  return;
}

Assistant:

ImageWindow::ImageWindow(const gimage::ImageFloat &image, int x, int y, int w, int h,
                         double vmin, double vmax) : BaseWindow("Image", 100, 100)
{
  ImageAdapterBase *p=new ImageAdapter<float>(&image, vmin, vmax);

  adapt=0;
  del=false;
  lastkey='\0';
  imx=imy=0;
  showinfo=false;

  addHelpText(createHelpText());

  std::ostringstream os;

  os << "Image - " << image.getWidth() << "x" << image.getHeight() << "x" <<
     image.getDepth() << " " << image.getTypeDescription();

  setTitle(os.str().c_str());

  if (w <= 0)
  {
    w=image.getWidth();
  }

  if (h <= 0)
  {
    h=image.getHeight();
  }

  setAdapter(p, true, keep_none, w, h);
  setVisible(true);

  if (x >= 0 && y >= 0)
  {
    setPosition(x, y);
  }
}